

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddVarint
          (UnknownFieldLiteParserHelper *this,uint32 num,uint64 value)

{
  long *in_RDI;
  string *in_stack_ffffffffffffffd8;
  
  if (*in_RDI != 0) {
    WriteVarint((uint64)in_RDI,in_stack_ffffffffffffffd8);
    WriteVarint((uint64)in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void AddVarint(uint32 num, uint64 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8, unknown_);
    WriteVarint(value, unknown_);
  }